

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void WebRtc_rdft(size_t n,int isgn,float *a,size_t *ip,float *w)

{
  long lVar1;
  size_t n_00;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  float *pfVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  n_00 = *ip;
  if (n_00 * 4 < n) {
    n_00 = n >> 2;
    *ip = n_00;
    ip[1] = 1;
    if (0xb < n) {
      uVar2 = n >> 3;
      fVar9 = 0.7853982 / (float)uVar2;
      w[0] = 1.0;
      w[1] = 0.0;
      dVar7 = cos((double)((float)uVar2 * fVar9));
      w[uVar2] = (float)dVar7;
      w[uVar2 + 1] = (float)dVar7;
      if (0x17 < n) {
        pfVar6 = w + (n_00 - 1);
        for (uVar3 = 2; uVar3 < uVar2; uVar3 = uVar3 + 2) {
          dVar7 = (double)((float)(long)uVar3 * fVar9);
          dVar8 = cos(dVar7);
          dVar7 = sin(dVar7);
          w[uVar3] = (float)dVar8;
          w[uVar3 + 1] = (float)dVar7;
          pfVar6[-1] = (float)dVar7;
          *pfVar6 = (float)dVar8;
          pfVar6 = pfVar6 + -2;
        }
        bitrv2(n_00,ip + 2,w);
      }
    }
  }
  sVar4 = ip[1];
  if (sVar4 * 4 < n) {
    sVar4 = n >> 2;
    ip[1] = sVar4;
    if (7 < n) {
      uVar3 = n >> 3;
      fVar9 = 0.7853982 / (float)uVar3;
      dVar7 = cos((double)((float)uVar3 * fVar9));
      w[n_00] = (float)dVar7;
      w[n_00 + uVar3] = (float)dVar7 * 0.5;
      pfVar6 = w + n_00 + (sVar4 - 1);
      for (uVar2 = 1; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        dVar7 = (double)((float)(long)uVar2 * fVar9);
        dVar8 = cos(dVar7);
        w[n_00 + uVar2] = (float)dVar8 * 0.5;
        dVar7 = sin(dVar7);
        *pfVar6 = (float)dVar7 * 0.5;
        pfVar6 = pfVar6 + -1;
      }
    }
  }
  if (isgn < 0) {
    fVar9 = (*a - a[1]) * 0.5;
    a[1] = fVar9;
    *a = *a - fVar9;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
        return;
      }
    }
    else {
      a[1] = -fVar9;
      uVar3 = n >> 1;
      lVar5 = 0;
      lVar1 = n - 2;
      for (uVar2 = 2; uVar2 < uVar3; uVar2 = uVar2 + 2) {
        lVar5 = lVar5 + (sVar4 * 2) / uVar3;
        fVar9 = (float)*(undefined8 *)(a + uVar2);
        fVar10 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
        fVar18 = fVar9 - (float)*(undefined8 *)(a + lVar1);
        fVar15 = (float)((ulong)*(undefined8 *)(a + lVar1) >> 0x20) + fVar10;
        fVar17 = (0.5 - w[n_00 + (sVar4 - lVar5)]) * fVar18 + fVar15 * w[n_00 + lVar5];
        fVar15 = (0.5 - w[n_00 + (sVar4 - lVar5)]) * fVar15 + fVar18 * -w[n_00 + lVar5];
        *(ulong *)(a + uVar2) = CONCAT44(fVar15 - fVar10,fVar9 - fVar17);
        *(ulong *)(a + lVar1) =
             CONCAT44(fVar15 - (float)((ulong)*(undefined8 *)(a + lVar1) >> 0x20),
                      fVar17 + (float)*(undefined8 *)(a + lVar1));
        lVar1 = lVar1 + -2;
      }
      a[uVar3 + 1] = -a[uVar3 + 1];
      bitrv2(n,ip + 2,a);
      if (n < 9) {
        uVar2 = 2;
      }
      else {
        cft1st(n,a,w);
        uVar2 = 8;
        while (uVar2 * 4 < n) {
          cftmdl(n,uVar2,a,w);
          uVar2 = uVar2 * 4;
        }
      }
      if (uVar2 * 4 - n == 0) {
        for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 2) {
          fVar10 = -a[1] - a[uVar2 + 1];
          fVar15 = *a + a[uVar2];
          fVar9 = a[uVar2 + 1] - a[1];
          fVar17 = *a - a[uVar2];
          fVar18 = (float)*(undefined8 *)(a + uVar2 * 2);
          fVar11 = (float)((ulong)*(undefined8 *)(a + uVar2 * 2) >> 0x20);
          fVar12 = (float)*(undefined8 *)(a + uVar2 * 3);
          fVar14 = fVar18 + fVar12;
          fVar13 = (float)((ulong)*(undefined8 *)(a + uVar2 * 3) >> 0x20);
          fVar16 = fVar11 + fVar13;
          fVar18 = fVar18 - fVar12;
          fVar11 = fVar11 - fVar13;
          *a = fVar15 + fVar14;
          a[1] = fVar10 - fVar16;
          a[uVar2 * 2] = fVar15 - fVar14;
          a[uVar2 * 2 + 1] = fVar16 + fVar10;
          *(ulong *)(a + uVar2) = CONCAT44(fVar9 - fVar18,fVar17 - fVar11);
          *(ulong *)(a + uVar2 * 3) = CONCAT44(fVar18 + fVar9,fVar11 + fVar17);
          a = a + 2;
        }
      }
      else {
        for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 2) {
          fVar9 = a[uVar3];
          fVar17 = a[uVar2 + uVar3];
          fVar15 = a[uVar2 + uVar3 + 1];
          a[uVar3] = fVar9 + fVar17;
          fVar10 = a[uVar3 + 1];
          a[uVar3 + 1] = -fVar10 - a[uVar2 + uVar3 + 1];
          *(ulong *)(a + uVar2 + uVar3) = CONCAT44(fVar15 - fVar10,fVar9 - fVar17);
        }
      }
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      lVar1 = 0;
      lVar5 = n - 2;
      for (uVar2 = 2; uVar2 < n >> 1; uVar2 = uVar2 + 2) {
        lVar1 = lVar1 + (sVar4 * 2) / (n >> 1);
        fVar15 = (float)*(undefined8 *)(a + uVar2);
        fVar10 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
        fVar18 = fVar15 - (float)*(undefined8 *)(a + lVar5);
        fVar17 = (float)((ulong)*(undefined8 *)(a + lVar5) >> 0x20) + fVar10;
        fVar9 = (0.5 - w[n_00 + (sVar4 - lVar1)]) * fVar18 + -w[n_00 + lVar1] * fVar17;
        fVar17 = (0.5 - w[n_00 + (sVar4 - lVar1)]) * fVar17 + w[n_00 + lVar1] * fVar18;
        *(ulong *)(a + uVar2) = CONCAT44(fVar10 - fVar17,fVar15 - fVar9);
        *(ulong *)(a + lVar5) =
             CONCAT44((float)((ulong)*(undefined8 *)(a + lVar5) >> 0x20) - fVar17,
                      (float)*(undefined8 *)(a + lVar5) + fVar9);
        lVar5 = lVar5 + -2;
      }
    }
    fVar9 = *a;
    *a = fVar9 + a[1];
    a[1] = fVar9 - a[1];
  }
  return;
}

Assistant:

void WebRtc_rdft(size_t n, int isgn, float *a, size_t *ip, float *w)
{
    size_t nw, nc;
    float xi;

    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 2)) {
        nc = n >> 2;
        makect(nc, ip, w + nw);
    }
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xi = a[0] - a[1];
        a[0] += a[1];
        a[1] = xi;
    } else {
        a[1] = 0.5f * (a[0] - a[1]);
        a[0] -= a[1];
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
}